

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5d835d::VendorExtQualType::printLeft(VendorExtQualType *this,OutputStream *S)

{
  Node *pNVar1;
  char *__src;
  size_t N;
  
  pNVar1 = this->Ty;
  (*pNVar1->_vptr_Node[4])(pNVar1);
  if (pNVar1->RHSComponentCache != No) {
    (*pNVar1->_vptr_Node[5])(pNVar1,S);
  }
  OutputStream::grow(S,1);
  S->Buffer[S->CurrentPosition] = ' ';
  S->CurrentPosition = S->CurrentPosition + 1;
  __src = (this->Ext).First;
  N = (long)(this->Ext).Last - (long)__src;
  if (N != 0) {
    OutputStream::grow(S,N);
    memmove(S->Buffer + S->CurrentPosition,__src,N);
    S->CurrentPosition = S->CurrentPosition + N;
  }
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    Ty->print(S);
    S += " ";
    S += Ext;
  }